

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write_string
          (xml_buffered_writer *this,char_t *data)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  
  for (uVar4 = this->bufsize; (*data != '\0' && (uVar4 < 0x800)); uVar4 = uVar4 + 1) {
    this->buffer[uVar4] = *data;
    data = data + 1;
  }
  if (uVar4 < 0x800) {
    this->bufsize = uVar4;
    return;
  }
  sVar1 = this->bufsize;
  sVar2 = get_valid_length(data + (sVar1 - uVar4),uVar4 - sVar1);
  this->bufsize = sVar2 + sVar1;
  sVar3 = strlen((char *)data);
  write_direct(this,data + ((sVar2 + sVar1) - uVar4),uVar4 + ((sVar3 - sVar2) - sVar1));
  return;
}

Assistant:

void write_string(const char_t* data)
		{
			// write the part of the string that fits in the buffer
			size_t offset = bufsize;

			while (*data && offset < bufcapacity)
				buffer[offset++] = *data++;

			// write the rest
			if (offset < bufcapacity)
			{
				bufsize = offset;
			}
			else
			{
				// backtrack a bit if we have split the codepoint
				size_t length = offset - bufsize;
				size_t extra = length - get_valid_length(data - length, length);

				bufsize = offset - extra;

				write_direct(data - extra, strlength(data) + extra);
			}
		}